

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

int yaml_parser_fetch_flow_collection_end(yaml_parser_t *parser,yaml_token_type_t type)

{
  yaml_simple_key_t **ppyVar1;
  size_t *psVar2;
  yaml_token_t **tail;
  byte bVar3;
  size_t sVar4;
  byte *pbVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  int iVar11;
  int iVar12;
  yaml_token_t *pyVar13;
  long lStack_a0;
  yaml_mark_t start_mark;
  undefined4 uStack_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 local_2c;
  undefined4 uStack_28;
  
  iVar11 = yaml_parser_remove_simple_key(parser);
  iVar12 = 0;
  if (iVar11 != 0) {
    if (parser->flow_level != 0) {
      parser->flow_level = parser->flow_level + -1;
      ppyVar1 = &(parser->simple_keys).top;
      *ppyVar1 = *ppyVar1 + -1;
    }
    parser->simple_key_allowed = 0;
    sVar4 = (parser->mark).column;
    sVar7 = (parser->mark).index;
    sVar8 = (parser->mark).line;
    (parser->mark).index = (parser->mark).index + 1;
    psVar2 = &(parser->mark).column;
    *psVar2 = *psVar2 + 1;
    parser->unread = parser->unread - 1;
    pbVar5 = (parser->buffer).pointer;
    bVar3 = *pbVar5;
    if ((char)bVar3 < '\0') {
      if ((bVar3 & 0xe0) == 0xc0) {
        lStack_a0 = 2;
      }
      else if ((bVar3 & 0xf0) == 0xe0) {
        lStack_a0 = 3;
      }
      else {
        lStack_a0 = (ulong)((bVar3 & 0xf8) == 0xf0) << 2;
      }
    }
    else {
      lStack_a0 = 1;
    }
    (parser->buffer).pointer = pbVar5 + lStack_a0;
    sVar6 = (parser->mark).column;
    sVar9 = (parser->mark).index;
    sVar10 = (parser->mark).line;
    local_2c = (undefined4)sVar4;
    uStack_28 = (undefined4)(sVar4 >> 0x20);
    uStack_38 = (undefined4)(sVar7 >> 0x20);
    uStack_34 = (undefined4)sVar8;
    uStack_30 = (undefined4)(sVar8 >> 0x20);
    tail = &(parser->tokens).tail;
    pyVar13 = (parser->tokens).tail;
    if (pyVar13 == (parser->tokens).end) {
      iVar12 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,tail,
                                 &(parser->tokens).end);
      if (iVar12 == 0) {
        parser->error = YAML_MEMORY_ERROR;
        return 0;
      }
      pyVar13 = *tail;
    }
    *tail = pyVar13 + 1;
    pyVar13->type = type;
    *(undefined8 *)&pyVar13->field_0x4 = 0;
    *(undefined8 *)((long)&(pyVar13->data).alias.value + 4) = 0;
    *(undefined8 *)((long)&(pyVar13->data).tag.suffix + 4) = 0;
    *(size_t *)((long)&pyVar13->data + 0x14) = sVar7 << 0x20;
    *(ulong *)((long)&(pyVar13->start_mark).index + 4) = CONCAT44(uStack_34,uStack_38);
    *(ulong *)((long)&(pyVar13->start_mark).line + 4) = CONCAT44(local_2c,uStack_30);
    *(undefined4 *)((long)&(pyVar13->start_mark).column + 4) = uStack_28;
    (pyVar13->end_mark).index = sVar9;
    (pyVar13->end_mark).line = sVar10;
    (pyVar13->end_mark).column = sVar6;
    iVar12 = 1;
  }
  return iVar12;
}

Assistant:

static int
yaml_parser_fetch_flow_collection_end(yaml_parser_t *parser,
        yaml_token_type_t type)
{
    yaml_mark_t start_mark, end_mark;
    yaml_token_t token;

    /* Reset any potential simple key on the current flow level. */

    if (!yaml_parser_remove_simple_key(parser))
        return 0;

    /* Decrease the flow level. */

    if (!yaml_parser_decrease_flow_level(parser))
        return 0;

    /* No simple keys after the indicators ']' and '}'. */

    parser->simple_key_allowed = 0;

    /* Consume the token. */

    start_mark = parser->mark;
    SKIP(parser);
    end_mark = parser->mark;

    /* Create the FLOW-SEQUENCE-END of FLOW-MAPPING-END token. */

    TOKEN_INIT(token, type, start_mark, end_mark);

    /* Append the token to the queue. */

    if (!ENQUEUE(parser, parser->tokens, token))
        return 0;

    return 1;
}